

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsqldriver.cpp
# Opt level: O0

void QSqlDriver::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte bVar1;
  bool bVar2;
  NumericalPrecisionPolicy NVar3;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  void *_v_1;
  void *_v;
  bool _r;
  QSqlDriver *_t;
  NumericalPrecisionPolicy in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  QString *in_stack_ffffffffffffffb8;
  QSqlDriver *in_stack_ffffffffffffffc0;
  NumericalPrecisionPolicy *pNVar4;
  undefined8 in_stack_ffffffffffffffc8;
  
  if (in_ESI == 0) {
    in_stack_ffffffffffffffb4 = in_EDX;
    if (in_EDX == 0) {
      notification(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   (NotificationSource)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (QVariant *)(ulong)in_stack_ffffffffffffffb0);
    }
    else if (in_EDX == 1) {
      bVar1 = (**(code **)(*in_RDI + 0x108))();
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = bVar1 & 1;
      }
    }
  }
  if ((in_ESI != 5) ||
     (bVar2 = QtMocHelpers::
              indexOfMethod<void(QSqlDriver::*)(QString_const&,QSqlDriver::NotificationSource,QVariant_const&)>
                        (in_RCX,(void **)notification,0,0), !bVar2)) {
    if ((in_ESI == 1) && (pNVar4 = *(NumericalPrecisionPolicy **)in_RCX, in_EDX == 0)) {
      NVar3 = numericalPrecisionPolicy
                        ((QSqlDriver *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                        );
      *pNVar4 = NVar3;
    }
    if ((in_ESI == 2) && (in_EDX == 0)) {
      setNumericalPrecisionPolicy
                ((QSqlDriver *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    }
  }
  return;
}

Assistant:

void QSqlDriver::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSqlDriver *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->notification((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSqlDriver::NotificationSource>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[3]))); break;
        case 1: { bool _r = _t->cancelQuery();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSqlDriver::*)(const QString & , QSqlDriver::NotificationSource , const QVariant & )>(_a, &QSqlDriver::notification, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v) = _t->numericalPrecisionPolicy(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNumericalPrecisionPolicy(*reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v)); break;
        default: break;
        }
    }
}